

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-projection.c
# Opt level: O0

_Bool borg_projectable_dark(wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2)

{
  _Bool _Var1;
  borg_grid *ag_00;
  borg_grid *ag;
  wchar_t local_28;
  wchar_t unknown;
  wchar_t x;
  wchar_t y;
  wchar_t dist;
  wchar_t x2_local;
  wchar_t y2_local;
  wchar_t x1_local;
  wchar_t y1_local;
  
  ag._4_4_ = 0;
  x = L'\0';
  local_28 = x1;
  unknown = y1;
  y = x2;
  dist = y2;
  x2_local = x1;
  y2_local = y1;
  while( true ) {
    if ((int)(uint)z_info->max_range < x) {
      return false;
    }
    ag_00 = borg_grids[unknown] + local_28;
    if ((x != L'\0') && (ag_00->feat == '\0')) {
      ag._4_4_ = ag._4_4_ + 1;
    }
    if ((x != L'\0') && (_Var1 = borg_cave_floor_grid(ag_00), !_Var1)) break;
    if (((local_28 == y) && (unknown == dist)) && (0 < ag._4_4_)) {
      return true;
    }
    if (ag_00->kill != '\0') {
      return false;
    }
    borg_inc_motion(&unknown,&local_28,y2_local,x2_local,dist,y);
    x = x + L'\x01';
  }
  return false;
}

Assistant:

bool borg_projectable_dark(int y1, int x1, int y2, int x2)
{
    int        dist, y, x;
    int        unknown = 0;
    borg_grid *ag;

    /* Start at the initial location */
    y = y1;
    x = x1;

    /* Simulate the spell/missile path */
    for (dist = 0; dist <= z_info->max_range; dist++) {
        /* Get the grid */
        ag = &borg_grids[y][x];

        /* We want at least 1 unknown grid */
        if (dist && (ag->feat == FEAT_NONE))
            unknown++;

        /* Never pass through walls/doors */
        if (dist && (!borg_cave_floor_grid(ag)))
            break;

        /* Check for arrival at "final target" */
        if ((x == x2) && (y == y2) && unknown >= 1)
            return true;

        /* Stop at monsters */
        if (ag->kill)
            break;

        /* Calculate the new location */
        borg_inc_motion(&y, &x, y1, x1, y2, x2);
    }

    /* Assume obstruction */
    return false;
}